

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bisstemeqblk(bstring b0,void *blk,int len)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar4 = -1;
  if ((((b0 != (bstring)0x0) && (puVar3 = b0->data, puVar3 != (uchar *)0x0)) &&
      (-1 < (b0->slen | len) && blk != (void *)0x0)) && (iVar4 = 0, len <= b0->slen)) {
    if (len == 0 || puVar3 == (uchar *)blk) {
      return 1;
    }
    uVar5 = (ulong)(uint)len;
    if (len < 1) {
      uVar5 = 0;
    }
    iVar4 = 0;
    uVar6 = 0;
    do {
      if (uVar5 == uVar6) {
        return 1;
      }
      puVar1 = puVar3 + uVar6;
      puVar2 = (uchar *)((long)blk + uVar6);
      uVar6 = uVar6 + 1;
    } while (*puVar1 == *puVar2);
  }
  return iVar4;
}

Assistant:

int bisstemeqblk (const bstring b0, const void * blk, int len) {
int i;

	if (bdata (b0) == NULL || b0->slen < 0 || NULL == blk || len < 0)
		return BSTR_ERR;
	if (b0->slen < len) return 0;
	if (b0->data == (const unsigned char *) blk || len == 0) return 1;

	for (i = 0; i < len; i ++) {
		if (b0->data[i] != ((const unsigned char *) blk)[i]) return 0;
	}
	return 1;
}